

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintDouble_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,double val)

{
  string *psVar1;
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  double val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._8_8_ = val;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintDouble
            (&this->delegate_,(double)generator.output_.field_2._8_8_,(BaseTextGenerator *)local_48)
  ;
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_
                     ((StringBaseTextGenerator *)local_48);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintDouble(double val) const {
  FORWARD_IMPL(PrintDouble, val);
}